

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

bool __thiscall node::runPrepare(node *this)

{
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  size_t *psVar1;
  char cVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  uint uVar6;
  pointer pbVar7;
  _Node *p_Var8;
  size_type sVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  string tmp;
  string line;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
  p;
  uchar local_e0;
  long *local_a0 [2];
  long local_90 [2];
  long *local_80 [2];
  long local_70 [2];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
  local_60;
  ulong local_38;
  
  this_00 = &this->labels;
  std::__cxx11::
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::_M_clear(&this_00->
              super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
            );
  (this->labels).
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->labels).
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->labels).
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ._M_impl._M_node._M_size = 0;
  this_01 = &this->code;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(this_01,(long)(this->inputCode).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->inputCode).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
  if ((this->inputCode).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->inputCode).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar10 = 0;
    local_e0 = '\0';
    do {
      pbVar7 = (this->inputCode).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->inputCode).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == pbVar7) {
LAB_0010cab0:
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((this->code).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar10));
      }
      else {
        bVar15 = false;
        uVar13 = 0;
        uVar14 = 1;
        local_38 = uVar10;
        do {
          local_a0[0] = local_90;
          pcVar3 = pbVar7[uVar10]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a0,pcVar3,pcVar3 + pbVar7[uVar10]._M_string_length);
          cVar2 = *(char *)((long)local_a0[0] + uVar13);
          if (cVar2 == ':') {
            local_60.first._M_dataplus._M_p = (pointer)&local_60.first.field_2;
            local_60.first._M_string_length = 0;
            local_60.first.field_2._M_local_buf[0] = '\0';
            local_60.second = '\0';
            std::__cxx11::string::substr((ulong)local_80,(ulong)local_a0);
            std::__cxx11::string::operator=((string *)&local_60,(string *)local_80);
            if (local_80[0] != local_70) {
              operator_delete(local_80[0],local_70[0] + 1);
            }
            local_60.second = local_e0;
            p_Var8 = std::__cxx11::
                     list<std::pair<std::__cxx11::string,unsigned_char>,std::allocator<std::pair<std::__cxx11::string,unsigned_char>>>
                     ::_M_create_node<std::pair<std::__cxx11::string,unsigned_char>const&>
                               ((list<std::pair<std::__cxx11::string,unsigned_char>,std::allocator<std::pair<std::__cxx11::string,unsigned_char>>>
                                 *)this_00,&local_60);
            std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
            psVar1 = &(this->labels).
                      super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
                      ._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            std::__cxx11::string::substr((ulong)local_80,(ulong)local_a0);
            std::__cxx11::string::find_first_not_of((char *)local_80,0x1100ee,0);
            if (local_80[0] != local_70) {
              operator_delete(local_80[0],local_70[0] + 1);
            }
            std::__cxx11::string::substr((ulong)local_80,(ulong)local_a0);
            std::__cxx11::string::operator=
                      ((string *)
                       ((this_01->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar10),(string *)local_80);
            if (local_80[0] != local_70) {
              operator_delete(local_80[0],local_70[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
              operator_delete(local_60.first._M_dataplus._M_p,
                              CONCAT71(local_60.first.field_2._M_allocated_capacity._1_7_,
                                       local_60.first.field_2._M_local_buf[0]) + 1);
            }
            bVar15 = true;
          }
          if (local_a0[0] != local_90) {
            operator_delete(local_a0[0],local_90[0] + 1);
          }
          if (cVar2 == ':') break;
          pbVar7 = (this->inputCode).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          bVar16 = uVar14 < (ulong)((long)(this->inputCode).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7
                                   >> 5);
          uVar13 = uVar14;
          uVar14 = (ulong)((int)uVar14 + 1);
        } while (bVar16);
        uVar10 = local_38;
        if (!bVar15) goto LAB_0010cab0;
      }
      local_e0 = local_e0 + '\x01';
      uVar10 = (ulong)(char)local_e0;
    } while (uVar10 < (ulong)((long)(this->inputCode).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->inputCode).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  bVar15 = (this->code).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish ==
           (this->code).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (!bVar15) {
    uVar10 = 0;
    do {
      pbVar7 = (this_01->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      sVar4 = pbVar7[uVar10]._M_string_length;
      bVar16 = sVar4 != 0;
      if (bVar16) {
        sVar9 = 0;
        do {
          if (pbVar7[uVar10]._M_dataplus._M_p[sVar9] == ':') {
            return bVar15;
          }
          sVar9 = sVar9 + 1;
        } while (sVar4 != sVar9);
        bVar16 = false;
      }
      uVar13 = (this_01->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar10]._M_string_length;
      uVar6 = (int)uVar13 - 1;
      if (-1 < (int)uVar6) {
        uVar13 = uVar13 & 0xffffffff;
        lVar11 = (ulong)uVar6 + 1;
        do {
          pbVar7 = (this_01->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          cVar2 = pbVar7[uVar10]._M_dataplus._M_p[lVar11 + -1];
          if ((cVar2 != ',') && (cVar2 != ' ')) {
            std::__cxx11::string::erase((ulong)(pbVar7 + uVar10),uVar13);
          }
          if ((cVar2 != ',') && (cVar2 != ' ')) break;
          uVar13 = uVar13 - 1;
          lVar12 = lVar11 + -1;
          bVar5 = 0 < lVar11;
          lVar11 = lVar12;
        } while (lVar12 != 0 && bVar5);
      }
      if (bVar16) {
        return bVar15;
      }
      uVar10 = (ulong)((int)uVar10 + 1);
      uVar13 = (long)(this->code).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->code).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      bVar15 = uVar13 <= uVar10;
    } while (uVar10 < uVar13);
  }
  return bVar15;
}

Assistant:

bool node::runPrepare(){
  std::vector<int> labelLines;
  labels.clear();
  code.resize(inputCode.size());
  for (int8_t i = 0; i < inputCode.size(); i++){
    bool label=false;
    for(unsigned int j=0;j<inputCode.size();j++){
      string line=inputCode[i];
      char ch=line[j];
      string tmp;      
      if(ch==':'){
	std::pair<std::string, uint8_t> p;
	int c;
	p.first=line.substr(0,j);
	p.second=i;
	labels.push_back(p);
	label=true;
	c=line.substr(j+1).find_first_not_of(" ");
	code[i]=line.substr(c+j+1);
	break;
      }
    }
    if(label==false){
      code[i]=inputCode[i];
    }
  }
  for(int i=0; i<labelLines.size();i++){
    string operand;
    bool label_exists=false;
    operand=code[labelLines[i]].substr(4);
    for(list<pair<string, uint8_t> >::iterator j=labels.begin();j!=labels.end();j++){
      if(j->first==operand){
	label_exists=true;
	break;
      }
    }
    if(label_exists==false)
      return false;
  }
  for(unsigned int i=0;i<code.size();i++){
    bool space=false;
    int  remove_count=0;
    for(int j=0; j<code[i].length();j++){
      char ch=code[i].c_str()[j];
      if(ch == ' '||ch==','){
	if(space){
	  code[i].erase(j, 1);              //get rid of whitespace
	  j--;
	}
	space=true;
      }
      if(ch==':')
	return false;
      else
	space=false;
    }
    for(int j=code[i].length()-1;j>=0;j--){
      char ch=code[i].c_str()[j];
      if(ch==' '||ch==',')
	remove_count++;
      else{
	code[i].erase(j+1, remove_count);
	break;
      }
    }
  }
  return true;
}